

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-knowledge.c
# Opt level: O0

void object_flavor_aware(player *p,object *obj)

{
  bool bVar1;
  _Bool _Var2;
  loc_conflict grid_00;
  loc_conflict grid;
  object *floor_obj;
  store *psStack_40;
  _Bool light;
  store *s;
  town *town;
  object *obj1;
  int local_20;
  wchar_t i;
  wchar_t x;
  wchar_t y;
  object *obj_local;
  player *p_local;
  
  if (obj->known == (object *)0x0) {
    __assert_fail("obj->known",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-knowledge.c"
                  ,0x938,"void object_flavor_aware(struct player *, struct object *)");
  }
  if ((obj->kind->aware & 1U) == 0) {
    obj->kind->aware = true;
    obj->known->effect = obj->effect;
    _Var2 = kind_is_ignored_unaware(obj->kind);
    if (_Var2) {
      kind_ignore_when_aware(obj->kind);
    }
    p->upkeep->notice = p->upkeep->notice | 2;
    for (town = (town *)p->gear; town != (town *)0x0; town = *(town **)&town->num_stores) {
      object_set_base_known(p,(object *)town);
    }
    for (obj1._4_4_ = 0; obj1._4_4_ < world->num_towns; obj1._4_4_ = obj1._4_4_ + 1) {
      for (psStack_40 = world->towns[obj1._4_4_].stores; psStack_40 != (store *)0x0;
          psStack_40 = psStack_40->next) {
        for (town = (town *)psStack_40->stock; town != (town *)0x0;
            town = *(town **)&town->num_stores) {
          object_set_base_known(p,(object *)town);
        }
      }
    }
    if (cave != (chunk_conflict *)0x0) {
      for (i = L'\x01'; i < cave->height; i = i + L'\x01') {
        for (local_20 = 1; local_20 < cave->width; local_20 = local_20 + 1) {
          bVar1 = false;
          grid_00 = (loc_conflict)loc(local_20,i);
          for (grid = (loc_conflict)square_object((chunk *)cave,grid_00); grid != (loc_conflict)0x0;
              grid = *(loc_conflict *)((long)grid + 0x20)) {
            if (*(object_kind **)grid == obj->kind) {
              bVar1 = true;
              break;
            }
          }
          if (bVar1) {
            square_light_spot((chunk *)cave,(loc)grid_00);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void object_flavor_aware(struct player *p, struct object *obj)
{
	int y, x, i;
	struct object *obj1;

	assert(obj->known);
	if (obj->kind->aware) return;
	obj->kind->aware = true;
	obj->known->effect = obj->effect;

	/* Fix ignore/autoinscribe */
	if (kind_is_ignored_unaware(obj->kind))
		kind_ignore_when_aware(obj->kind);
	p->upkeep->notice |= PN_IGNORE;

	/* Update player objects */
	for (obj1 = p->gear; obj1; obj1 = obj1->next)
		object_set_base_known(p, obj1);

	/* Store objects */
	for (i = 0; i < world->num_towns; i++) {
		struct town *town = &world->towns[i];
		struct store *s = town->stores;
		while (s) {
			for (obj1 = s->stock; obj1; obj1 = obj1->next) {
				object_set_base_known(p, obj1);
			}
			s = s->next;
		}
	}

	/* Quit if no dungeon yet */
	if (!cave) return;

	/* Some objects change tile on awareness, so update display for all
	 * floor objects of this kind */
	for (y = 1; y < cave->height; y++) {
		for (x = 1; x < cave->width; x++) {
			bool light = false;
			const struct object *floor_obj;
			struct loc grid = loc(x, y);

			for (floor_obj = square_object(cave, grid); floor_obj;
				 floor_obj = floor_obj->next)
				if (floor_obj->kind == obj->kind) {
					light = true;
					break;
				}

			if (light) square_light_spot(cave, grid);
		}
	}
}